

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Boundary_Uniform.cpp
# Opt level: O3

void __thiscall
Nova::Boundary_Uniform<float,_3>::Find_Ghost_Regions
          (Boundary_Uniform<float,_3> *this,T_Grid *grid,Array<Nova::Range<int,_3>_> *regions,
          int number_of_ghost_cells)

{
  pointer pRVar1;
  ulong uVar2;
  undefined8 uVar3;
  long lVar4;
  Range<int,_3> domain;
  Vector<int,_3,_true> data_copy_1;
  Vector<int,_3,_true> data_copy;
  int local_80;
  int iStack_7c;
  int local_78;
  int local_74;
  int iStack_70;
  int local_6c;
  int local_68 [4];
  int local_58 [4];
  int local_48;
  int iStack_44;
  undefined8 uStack_40;
  int local_38;
  int iStack_34;
  undefined8 uStack_30;
  
  lVar4 = 0;
  Grid<float,_3>::Cell_Indices(grid,0);
  local_58[2] = local_78;
  local_58[0] = local_80;
  local_58[1] = iStack_7c;
  do {
    *(int *)((long)local_58 + lVar4) = *(int *)((long)local_58 + lVar4) - number_of_ghost_cells;
    lVar4 = lVar4 + 4;
  } while (lVar4 != 0xc);
  local_68[2] = local_6c;
  local_68[0] = local_74;
  local_68[1] = iStack_70;
  lVar4 = 0;
  do {
    *(int *)((long)local_68 + lVar4) = *(int *)((long)local_68 + lVar4) + number_of_ghost_cells;
    lVar4 = lVar4 + 4;
  } while (lVar4 != 0xc);
  local_48 = local_58[1];
  iStack_44 = local_58[2];
  uStack_40 = 0;
  local_38 = local_68[1];
  iStack_34 = local_68[2];
  uStack_30 = 0;
  std::vector<Nova::Range<int,_3>,_std::allocator<Nova::Range<int,_3>_>_>::resize(&regions->_data,6)
  ;
  pRVar1 = (regions->_data).
           super__Vector_base<Nova::Range<int,_3>,_std::allocator<Nova::Range<int,_3>_>_>._M_impl.
           super__Vector_impl_data._M_start;
  if ((regions->_data).
      super__Vector_base<Nova::Range<int,_3>,_std::allocator<Nova::Range<int,_3>_>_>._M_impl.
      super__Vector_impl_data._M_finish == pRVar1) {
    uVar3 = 0;
    uVar2 = 0;
  }
  else {
    (pRVar1->min_corner)._data._M_elems[0] = local_58[0];
    *(ulong *)((pRVar1->min_corner)._data._M_elems + 1) = CONCAT44(local_78,iStack_7c);
    (pRVar1->max_corner)._data._M_elems[0] = local_80 + -1;
    *(ulong *)((pRVar1->max_corner)._data._M_elems + 1) = CONCAT44(local_6c,iStack_70);
    pRVar1 = (regions->_data).
             super__Vector_base<Nova::Range<int,_3>,_std::allocator<Nova::Range<int,_3>_>_>._M_impl.
             super__Vector_impl_data._M_start;
    uVar2 = ((long)(regions->_data).
                   super__Vector_base<Nova::Range<int,_3>,_std::allocator<Nova::Range<int,_3>_>_>.
                   _M_impl.super__Vector_impl_data._M_finish - (long)pRVar1 >> 3) *
            -0x5555555555555555;
    if (uVar2 < 2) {
      uVar3 = 1;
    }
    else {
      pRVar1[1].min_corner._data._M_elems[0] = local_74 + 1;
      *(int *)((long)&pRVar1[1].min_corner._data + 4) = iStack_7c;
      *(int *)((long)&pRVar1[1].min_corner._data + 8) = local_78;
      pRVar1[1].max_corner._data._M_elems[0] = local_68[0];
      *(int *)((long)&pRVar1[1].max_corner._data + 4) = iStack_70;
      *(int *)((long)&pRVar1[1].max_corner._data + 8) = local_6c;
      pRVar1 = (regions->_data).
               super__Vector_base<Nova::Range<int,_3>,_std::allocator<Nova::Range<int,_3>_>_>.
               _M_impl.super__Vector_impl_data._M_start;
      uVar2 = ((long)(regions->_data).
                     super__Vector_base<Nova::Range<int,_3>,_std::allocator<Nova::Range<int,_3>_>_>.
                     _M_impl.super__Vector_impl_data._M_finish - (long)pRVar1 >> 3) *
              -0x5555555555555555;
      if (uVar2 < 3) {
        uVar3 = 2;
      }
      else {
        pRVar1[2].min_corner._data._M_elems[0] = local_58[0];
        *(int *)((long)&pRVar1[2].min_corner._data + 4) = local_48;
        *(int *)((long)&pRVar1[2].min_corner._data + 8) = local_78;
        pRVar1[2].max_corner._data._M_elems[0] = local_68[0];
        *(int *)((long)&pRVar1[2].max_corner._data + 4) = iStack_7c + -1;
        *(int *)((long)&pRVar1[2].max_corner._data + 8) = local_6c;
        pRVar1 = (regions->_data).
                 super__Vector_base<Nova::Range<int,_3>,_std::allocator<Nova::Range<int,_3>_>_>.
                 _M_impl.super__Vector_impl_data._M_start;
        uVar2 = ((long)(regions->_data).
                       super__Vector_base<Nova::Range<int,_3>,_std::allocator<Nova::Range<int,_3>_>_>
                       ._M_impl.super__Vector_impl_data._M_finish - (long)pRVar1 >> 3) *
                -0x5555555555555555;
        if (uVar2 < 4) {
          uVar3 = 3;
        }
        else {
          pRVar1[3].min_corner._data._M_elems[0] = local_58[0];
          *(int *)((long)&pRVar1[3].min_corner._data + 4) = iStack_70 + 1;
          *(int *)((long)&pRVar1[3].min_corner._data + 8) = local_78;
          pRVar1[3].max_corner._data._M_elems[0] = local_68[0];
          *(int *)((long)&pRVar1[3].max_corner._data + 4) = local_38;
          *(int *)((long)&pRVar1[3].max_corner._data + 8) = local_6c;
          pRVar1 = (regions->_data).
                   super__Vector_base<Nova::Range<int,_3>,_std::allocator<Nova::Range<int,_3>_>_>.
                   _M_impl.super__Vector_impl_data._M_start;
          uVar2 = ((long)(regions->_data).
                         super__Vector_base<Nova::Range<int,_3>,_std::allocator<Nova::Range<int,_3>_>_>
                         ._M_impl.super__Vector_impl_data._M_finish - (long)pRVar1 >> 3) *
                  -0x5555555555555555;
          if (uVar2 < 5) {
            uVar3 = 4;
          }
          else {
            pRVar1[4].min_corner._data._M_elems[0] = local_58[0];
            *(int *)((long)&pRVar1[4].min_corner._data + 4) = local_48;
            *(int *)((long)&pRVar1[4].min_corner._data + 8) = iStack_44;
            pRVar1[4].max_corner._data._M_elems[0] = local_68[0];
            *(int *)((long)&pRVar1[4].max_corner._data + 4) = local_38;
            *(int *)((long)&pRVar1[4].max_corner._data + 8) = local_78 + -1;
            pRVar1 = (regions->_data).
                     super__Vector_base<Nova::Range<int,_3>,_std::allocator<Nova::Range<int,_3>_>_>.
                     _M_impl.super__Vector_impl_data._M_start;
            uVar2 = ((long)(regions->_data).
                           super__Vector_base<Nova::Range<int,_3>,_std::allocator<Nova::Range<int,_3>_>_>
                           ._M_impl.super__Vector_impl_data._M_finish - (long)pRVar1 >> 3) *
                    -0x5555555555555555;
            if (5 < uVar2) {
              pRVar1[5].min_corner._data._M_elems[0] = local_58[0];
              *(int *)((long)&pRVar1[5].min_corner._data + 4) = local_48;
              *(int *)((long)&pRVar1[5].min_corner._data + 8) = local_6c + 1;
              pRVar1[5].max_corner._data._M_elems[0] = local_68[0];
              *(int *)((long)&pRVar1[5].max_corner._data + 4) = local_38;
              *(int *)((long)&pRVar1[5].max_corner._data + 8) = iStack_34;
              return;
            }
            uVar3 = 5;
          }
        }
      }
    }
  }
  std::__throw_out_of_range_fmt
            ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)",uVar3,uVar2
            );
}

Assistant:

void Boundary_Uniform<T,d>::
Find_Ghost_Regions(const T_Grid& grid,Array<Range<int,d> >& regions,const int number_of_ghost_cells) const
{
    Range<int,d> domain=grid.Cell_Indices(),ghost=domain.Thickened(number_of_ghost_cells);
    regions.resize(T_Grid::number_of_faces_per_cell);
    Find_Ghost_Regions_Helper(regions,domain,ghost);
}